

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EdExplFinder.cpp
# Opt level: O0

void __thiscall
EdExplFinder::debug_print(EdExplFinder *this,vector<int,_std::allocator<int>_> *shortestPathMatrix)

{
  int iVar1;
  ostream *poVar2;
  uint *puVar3;
  vector<int,_std::allocator<int>_> *in_RSI;
  EdExplFinder *in_RDI;
  int j;
  int i_2;
  int i_1;
  int i;
  int local_20;
  uint local_1c;
  int local_18;
  uint local_14;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "***************************************************************");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"shortest path matrix:");
  std::operator<<(poVar2,'\n');
  std::operator<<((ostream *)&std::cout,"   ");
  for (local_14 = 0; (int)local_14 < in_RDI->seqSize + 1; local_14 = local_14 + 1) {
    printf("%2d ",(ulong)local_14);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  for (local_18 = 0; local_18 < in_RDI->seqSize + 2; local_18 = local_18 + 1) {
    std::operator<<((ostream *)&std::cout,"---");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  for (local_1c = 0; (int)local_1c < in_RDI->seqSize + 1; local_1c = local_1c + 1) {
    for (local_20 = -1; local_20 < in_RDI->seqSize + 1; local_20 = local_20 + 1) {
      if (local_20 == -1) {
        printf("%2d|",(ulong)local_1c);
      }
      else {
        iVar1 = matrixCoord(in_RDI,local_1c,local_20);
        puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)iVar1);
        printf("%2d ",(ulong)*puVar3);
      }
    }
    std::operator<<((ostream *)&std::cout,'\n');
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "***************************************************************");
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void EdExplFinder::debug_print(std::vector<int>* shortestPathMatrix) const {
	std::cout << "***************************************************************" << '\n';

	std::cout << "shortest path matrix:" << '\n';

	std::cout << "   ";
	for (int i = 0; i < seqSize + 1; i++) {
		printf("%2d ", i);
	}
	std::cout << '\n';

	for (int i = 0; i < seqSize + 2; i++) {
		std::cout << "---";
	}
	std::cout << '\n';

	for (int i = 0; i < seqSize + 1; i++) {
		for (int j = -1; j < seqSize + 1; j++) {
			if (j == -1) {
				printf("%2d|", i);
			} else {
				printf("%2d ", (*shortestPathMatrix)[matrixCoord(i, j)]);
			}
		}
		std::cout << '\n';
	}

	std::cout << "***************************************************************" << '\n';
}